

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

void __thiscall
QHstsCache::updateKnownHost(QHstsCache *this,QUrl *url,QDateTime *expires,bool includeSubDomains)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    QUrl::host(&QStack_48,url,0x7f00000);
    updateKnownHost(this,(QString *)&QStack_48,expires,includeSubDomains);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    if (this->hstsStore != (QHstsStore *)0x0) {
      QHstsStore::synchronize(this->hstsStore);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsCache::updateKnownHost(const QUrl &url, const QDateTime &expires,
                                 bool includeSubDomains)
{
    if (!url.isValid())
        return;

    updateKnownHost(url.host(), expires, includeSubDomains);
#if QT_CONFIG(settings)
    if (hstsStore)
        hstsStore->synchronize();
#endif // QT_CONFIG(settings)
}